

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::sr::ShaderRenderCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,ShaderRenderCaseInstance *this)

{
  TextureFormat TVar1;
  uint width;
  uint uVar2;
  bool bVar3;
  QuadGrid *pQVar4;
  uint height;
  Surface resImage;
  Surface refImage;
  PixelBufferAccess local_98;
  Surface local_70;
  undefined1 local_58 [40];
  
  (*(this->super_TestInstance)._vptr_TestInstance[4])(this);
  width = (this->m_renderSize).m_data[0];
  if (0x7f < width) {
    width = 0x80;
  }
  uVar2 = (this->m_renderSize).m_data[1];
  height = 0x80;
  if (uVar2 < 0x80) {
    height = uVar2;
  }
  pQVar4 = (QuadGrid *)operator_new(0x130);
  local_58._0_8_ = 0x3e8000003e000000;
  local_58._8_8_ = 0x3f8000003f000000;
  QuadGrid::QuadGrid(pQVar4,this->m_quadGridSize,width,height,(Vec4 *)local_58,
                     &this->m_userAttribTransforms,&this->m_textures);
  local_98.super_ConstPixelBufferAccess.m_format.order = R;
  local_98.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  if ((this->m_quadGrid).super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>
      .m_data.ptr != pQVar4) {
    de::details::UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>::reset
              (&(this->m_quadGrid).
                super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>);
    (this->m_quadGrid).super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>.
    m_data.ptr = pQVar4;
  }
  de::details::UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>::reset
            ((UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_> *)&local_98);
  tcu::Surface::Surface(&local_70,width,height);
  pQVar4 = (this->m_quadGrid).
           super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>.m_data.ptr;
  render(this,pQVar4->m_numVertices,pQVar4->m_numTriangles * 3,
         (pQVar4->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
         _M_impl.super__Vector_impl_data._M_start,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
         &pQVar4->m_constCoords);
  local_58._0_4_ = RGBA;
  local_58._4_4_ = UNORM_INT8;
  if ((void *)local_70.m_pixels.m_cap != (void *)0x0) {
    local_70.m_pixels.m_cap = (size_t)local_70.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_98,(TextureFormat *)local_58,local_70.m_width,local_70.m_height,1,
             (void *)local_70.m_pixels.m_cap);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_58,&this->m_resultImage);
  tcu::copy((EVP_PKEY_CTX *)&local_98,(EVP_PKEY_CTX *)local_58);
  tcu::Surface::Surface((Surface *)local_58,width,height);
  pQVar4 = (this->m_quadGrid).
           super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>.m_data.ptr;
  if (this->m_isVertexCase == true) {
    computeVertexReference(this,(Surface *)local_58,pQVar4);
  }
  else {
    computeFragmentReference(this,(Surface *)local_58,pQVar4);
  }
  bVar3 = tcu::fuzzyCompare(((this->super_TestInstance).m_context)->m_testCtx->m_log,
                            "ComparisonResult","Image comparison result",(Surface *)local_58,
                            &local_70,0.2,COMPARE_LOG_EVERYTHING);
  TVar1 = (TextureFormat)(local_98.super_ConstPixelBufferAccess.m_size.m_data + 2);
  local_98.super_ConstPixelBufferAccess.m_format = TVar1;
  if (bVar3) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Result image matches reference","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_98.super_ConstPixelBufferAccess.m_format,
               (undefined1 *)
               (local_98.super_ConstPixelBufferAccess.m_size.m_data._0_8_ +
               (long)local_98.super_ConstPixelBufferAccess.m_format));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Image mismatch","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_98.super_ConstPixelBufferAccess.m_format,
               (undefined1 *)
               (local_98.super_ConstPixelBufferAccess.m_size.m_data._0_8_ +
               (long)local_98.super_ConstPixelBufferAccess.m_format));
  }
  if (local_98.super_ConstPixelBufferAccess.m_format != TVar1) {
    operator_delete((void *)local_98.super_ConstPixelBufferAccess.m_format,
                    local_98.super_ConstPixelBufferAccess._16_8_ + 1);
  }
  tcu::Surface::~Surface((Surface *)local_58);
  tcu::Surface::~Surface(&local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ShaderRenderCaseInstance::iterate (void)
{
	setup();

	// Create quad grid.
	const tcu::UVec2	viewportSize	= getViewportSize();
	const int			width			= viewportSize.x();
	const int			height			= viewportSize.y();

	m_quadGrid							= de::MovePtr<QuadGrid>(new QuadGrid(m_quadGridSize, width, height, getDefaultConstCoords(), m_userAttribTransforms, m_textures));

	// Render result.
	tcu::Surface		resImage		(width, height);

	render(m_quadGrid->getNumVertices(), m_quadGrid->getNumTriangles(), m_quadGrid->getIndices(), m_quadGrid->getConstCoords());
	tcu::copy(resImage.getAccess(), m_resultImage.getAccess());

	// Compute reference.
	tcu::Surface		refImage		(width, height);
	if (m_isVertexCase)
		computeVertexReference(refImage, *m_quadGrid);
	else
		computeFragmentReference(refImage, *m_quadGrid);

	// Compare.
	const bool			compareOk		= compareImages(resImage, refImage, 0.2f);

	if (compareOk)
		return tcu::TestStatus::pass("Result image matches reference");
	else
		return tcu::TestStatus::fail("Image mismatch");
}